

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

void bitset_container_offset
               (bitset_container_t *c,container_t **loc,container_t **hic,uint16_t offset)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  int iVar3;
  ulong uVar4;
  bitset_container_t *bitset;
  sbyte sVar5;
  undefined6 in_register_0000000a;
  uint uVar6;
  ulong uVar8;
  long lVar9;
  short sVar10;
  uint uVar11;
  ulong uVar7;
  
  uVar4 = CONCAT62(in_register_0000000a,offset) >> 6;
  uVar11 = (uint)CONCAT62(in_register_0000000a,offset) & 0x3f;
  uVar6 = 0x400 - ((uint)uVar4 & 0x3ffffff) & 0xffff;
  uVar7 = (ulong)uVar6;
  uVar4 = uVar4 & 0xffff;
  sVar10 = (short)uVar11;
  sVar5 = (sbyte)uVar11;
  if (loc == (container_t **)0x0) {
LAB_0010f8f6:
    bitset = bitset_container_create();
  }
  else {
    bitset = bitset_container_create();
    if (sVar10 == 0) {
      memcpy((void *)((ulong)(uint)((int)uVar4 * 8) + (long)bitset->words),c->words,
             (ulong)(uVar6 * 8));
    }
    else {
      puVar1 = c->words;
      puVar2 = bitset->words;
      puVar2[uVar4] = *puVar1 << sVar5;
      for (uVar8 = 1; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        (puVar2 + uVar4)[uVar8] =
             puVar1[uVar8 - 1] >> (0x40U - sVar5 & 0x3f) | puVar1[uVar8] << sVar5;
      }
    }
    iVar3 = bitset_container_compute_cardinality(bitset);
    bitset->cardinality = iVar3;
    if (iVar3 != 0) {
      *loc = bitset;
    }
    if (iVar3 == c->cardinality) {
      return;
    }
    if (hic == (container_t **)0x0) {
      if (iVar3 != 0) {
        return;
      }
      goto LAB_0010f9ac;
    }
    if (iVar3 != 0) goto LAB_0010f8f6;
  }
  if (sVar10 == 0) {
    memcpy(bitset->words,(void *)((ulong)(uVar6 << 3) + (long)c->words),
           (ulong)(uint)((int)uVar4 << 3));
  }
  else {
    puVar1 = c->words;
    for (lVar9 = 0; 0x400 - uVar7 != lVar9; lVar9 = lVar9 + 1) {
      bitset->words[lVar9] =
           puVar1[uVar7 + lVar9 + -1] >> (0x40U - sVar5 & 0x3f) | puVar1[uVar7 + lVar9] << sVar5;
    }
    bitset->words[uVar4] = puVar1[0x3ff] >> (0x40U - sVar5 & 0x3f);
  }
  iVar3 = bitset_container_compute_cardinality(bitset);
  bitset->cardinality = iVar3;
  if (iVar3 != 0) {
    *hic = bitset;
    return;
  }
LAB_0010f9ac:
  bitset_container_free(bitset);
  return;
}

Assistant:

void bitset_container_offset(const bitset_container_t *c, container_t **loc,
                             container_t **hic, uint16_t offset) {
    bitset_container_t *bc = NULL;
    uint64_t val;
    uint16_t b, i, end;

    b = offset >> 6;
    i = offset % 64;
    end = 1024 - b;

    if (loc != NULL) {
        bc = bitset_container_create();
        if (i == 0) {
            memcpy(bc->words + b, c->words, 8 * end);
        } else {
            bc->words[b] = c->words[0] << i;
            for (uint32_t k = 1; k < end; ++k) {
                val = c->words[k] << i;
                val |= c->words[k - 1] >> (64 - i);
                bc->words[b + k] = val;
            }
        }

        bc->cardinality = bitset_container_compute_cardinality(bc);
        if (bc->cardinality != 0) {
            *loc = bc;
        }
        if (bc->cardinality == c->cardinality) {
            return;
        }
    }

    if (hic == NULL) {
        // Both hic and loc can't be NULL, so bc is never NULL here
        if (bc->cardinality == 0) {
            bitset_container_free(bc);
        }
        return;
    }

    if (bc == NULL || bc->cardinality != 0) {
        bc = bitset_container_create();
    }

    if (i == 0) {
        memcpy(bc->words, c->words + end, 8 * b);
    } else {
        for (uint32_t k = end; k < 1024; ++k) {
            val = c->words[k] << i;
            val |= c->words[k - 1] >> (64 - i);
            bc->words[k - end] = val;
        }
        bc->words[b] = c->words[1023] >> (64 - i);
    }

    bc->cardinality = bitset_container_compute_cardinality(bc);
    if (bc->cardinality == 0) {
        bitset_container_free(bc);
        return;
    }
    *hic = bc;
}